

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar2 = 0;
  iVar1 = ParamDict::get(pd,0,0);
  this->resize_type = iVar1;
  fVar3 = ParamDict::get(pd,1,1.0);
  this->height_scale = fVar3;
  fVar3 = ParamDict::get(pd,2,1.0);
  this->width_scale = fVar3;
  iVar1 = ParamDict::get(pd,3,0);
  this->output_height = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->output_width = iVar1;
  if (this->resize_type - 4U < 0xfffffffd) {
    fprintf(_stderr,"unsupported resize type %d\n");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);

    if (resize_type < 1 || resize_type > 3)
    {
        fprintf(stderr, "unsupported resize type %d\n", resize_type);
        return -1;
    }

    return 0;
}